

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Constr.c
# Opt level: O0

Vec_Int_t * Llb_ManComputeBaseCase(Aig_Man_t *p,DdManager *dd)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Vec_Int_t *p_00;
  Aig_Obj_t *pObj_00;
  int local_34;
  int i;
  Aig_Obj_t *pRoot;
  Aig_Obj_t *pObj;
  Vec_Int_t *vNodes;
  DdManager *dd_local;
  Aig_Man_t *p_local;
  
  pAVar2 = Aig_ManCo(p,0);
  iVar1 = Aig_ManObjNumMax(p);
  p_00 = Vec_IntStartFull(iVar1);
  for (local_34 = 0; iVar1 = Vec_PtrSize(p->vObjs), local_34 < iVar1; local_34 = local_34 + 1) {
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,local_34);
    if ((pObj_00 != (Aig_Obj_t *)0x0) &&
       ((iVar1 = Aig_ObjIsNode(pObj_00), iVar1 != 0 || (iVar1 = Aig_ObjIsCi(pObj_00), iVar1 != 0))))
    {
      iVar1 = Cudd_bddLeq(dd,(DdNode *)(pObj_00->field_5).pData,
                          (DdNode *)((ulong)(pAVar2->field_5).pData ^ 1));
      if (iVar1 == 0) {
        iVar1 = Cudd_bddLeq(dd,(DdNode *)((ulong)(pObj_00->field_5).pData ^ 1),
                            (DdNode *)((ulong)(pAVar2->field_5).pData ^ 1));
        if (iVar1 != 0) {
          Vec_IntWriteEntry(p_00,local_34,0);
        }
      }
      else {
        Vec_IntWriteEntry(p_00,local_34,1);
      }
    }
  }
  return p_00;
}

Assistant:

Vec_Int_t * Llb_ManComputeBaseCase( Aig_Man_t * p, DdManager * dd )
{
    Vec_Int_t * vNodes;
    Aig_Obj_t * pObj, * pRoot;
    int i;
    pRoot = Aig_ManCo( p, 0 );
    vNodes = Vec_IntStartFull( Aig_ManObjNumMax(p) );
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( !Aig_ObjIsNode(pObj) && !Aig_ObjIsCi(pObj) )
            continue;
        if ( Cudd_bddLeq( dd, (DdNode *)pObj->pData, Cudd_Not(pRoot->pData) ) )
            Vec_IntWriteEntry( vNodes, i, 1 );
        else if ( Cudd_bddLeq( dd, Cudd_Not((DdNode *)pObj->pData), Cudd_Not(pRoot->pData) ) )
            Vec_IntWriteEntry( vNodes, i, 0 );
    }
    return vNodes;
}